

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err http_init(nni_http_conn **connp,nng_stream *data,_Bool client)

{
  nng_http *conn_00;
  uint8_t *puVar1;
  nni_http_conn *conn;
  _Bool client_local;
  nng_stream *data_local;
  nni_http_conn **connp_local;
  
  conn_00 = (nng_http *)nni_zalloc(0x8e8);
  if (conn_00 == (nng_http *)0x0) {
    connp_local._4_4_ = NNG_ENOMEM;
  }
  else {
    conn_00->client = client;
    nni_mtx_init(&conn_00->mtx);
    nni_aio_list_init(&conn_00->rdq);
    nni_aio_list_init(&conn_00->wrq);
    nni_http_req_init(&conn_00->req);
    nni_http_res_init(&conn_00->res);
    nni_http_set_version(conn_00,"HTTP/1.1");
    nni_http_set_method(conn_00,"GET");
    puVar1 = (uint8_t *)nni_alloc(0x1fe0);
    conn_00->buf = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      nni_http_conn_fini(conn_00);
      connp_local._4_4_ = NNG_ENOMEM;
    }
    else {
      conn_00->bufsz = 0x1fe0;
      nni_aio_init(&conn_00->wr_aio,http_wr_cb,conn_00);
      nni_aio_init(&conn_00->rd_aio,http_rd_cb,conn_00);
      conn_00->sock = data;
      *connp = conn_00;
      connp_local._4_4_ = NNG_OK;
    }
  }
  return connp_local._4_4_;
}

Assistant:

static nng_err
http_init(nni_http_conn **connp, nng_stream *data, bool client)
{
	nni_http_conn *conn;

	if ((conn = NNI_ALLOC_STRUCT(conn)) == NULL) {
		return (NNG_ENOMEM);
	}
	conn->client = client;
	nni_mtx_init(&conn->mtx);
	nni_aio_list_init(&conn->rdq);
	nni_aio_list_init(&conn->wrq);
	nni_http_req_init(&conn->req);
	nni_http_res_init(&conn->res);
	nni_http_set_version(conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_method(conn, "GET");

	if ((conn->buf = nni_alloc(HTTP_BUFSIZE)) == NULL) {
		nni_http_conn_fini(conn);
		return (NNG_ENOMEM);
	}
	conn->bufsz = HTTP_BUFSIZE;

	nni_aio_init(&conn->wr_aio, http_wr_cb, conn);
	nni_aio_init(&conn->rd_aio, http_rd_cb, conn);

	conn->sock = data;

	*connp = conn;

	return (NNG_OK);
}